

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::ipc::Deferred<perfetto::protos::gen::ObserveEventsResponse>::Deferred
          (Deferred<perfetto::protos::gen::ObserveEventsResponse> *this,DeferredBase *other)

{
  _Manager_type p_Var1;
  
  (this->super_DeferredBase).callback_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_DeferredBase).callback_._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->super_DeferredBase).callback_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_DeferredBase).callback_.super__Function_base._M_functor + 8) =
       0;
  std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::operator=
            ((function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> *)this,
             &other->callback_);
  p_Var1 = (other->callback_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)other,(_Any_data *)other,__destroy_functor);
    (other->callback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (other->callback_)._M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

explicit Deferred(DeferredBase&& other) {
    callback_ = std::move(other.callback_);
    other.callback_ = nullptr;
  }